

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_CreatePegoutLogkingScriptTest_Test::TestBody
          (ScriptUtil_CreatePegoutLogkingScriptTest_Test *this)

{
  allocator<PegoutTestVector> *this_00;
  initializer_list<PegoutTestVector> __l;
  bool bVar1;
  reference pPVar2;
  char *pcVar3;
  char *rhs;
  PegoutTestVector *local_bd8;
  AssertHelper local_a00;
  Message local_9f8;
  string local_9f0;
  string local_9d0;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar;
  Message local_998 [2];
  Script local_988;
  undefined1 local_950 [8];
  PegoutTestVector test_vector;
  iterator __end1;
  iterator __begin1;
  vector<PegoutTestVector,_std::allocator<PegoutTestVector>_> *__range1;
  Script actual;
  string local_838;
  allocator local_811;
  string local_810;
  allocator local_7e9;
  string local_7e8;
  undefined1 local_7c5;
  undefined1 local_7c4;
  undefined1 local_7c3;
  undefined1 local_7c2;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  allocator local_771;
  string local_770;
  allocator local_749;
  string local_748;
  undefined1 local_725;
  undefined1 local_724;
  undefined1 local_723;
  undefined1 local_722;
  allocator local_721;
  string local_720;
  allocator local_6f9;
  string local_6f8;
  allocator local_6d1;
  string local_6d0;
  allocator local_6a9;
  string local_6a8;
  undefined1 local_685;
  undefined1 local_684;
  undefined1 local_683;
  undefined1 local_682;
  allocator local_681;
  string local_680;
  allocator local_659;
  string local_658;
  allocator local_631;
  string local_630;
  allocator local_609;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  undefined1 local_5bd;
  undefined1 local_5bc;
  undefined1 local_5bb;
  undefined1 local_5ba;
  allocator local_5b9;
  string local_5b8;
  allocator local_591;
  string local_590;
  allocator local_569;
  string local_568;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  undefined1 local_4f5;
  undefined1 local_4f4;
  undefined1 local_4f3;
  undefined1 local_4f2;
  allocator local_4f1;
  string local_4f0;
  PegoutTestVector *local_4c0;
  PegoutTestVector local_4b8;
  BlockHash local_3f8;
  Script SStack_3d8;
  Pubkey PStack_3a0;
  ByteData BStack_388;
  Script SStack_370;
  BlockHash local_338;
  Script SStack_318;
  Pubkey PStack_2e0;
  ByteData BStack_2c8;
  Script SStack_2b0;
  BlockHash local_278;
  Script SStack_258;
  Pubkey PStack_220;
  ByteData BStack_208;
  Script SStack_1f0;
  BlockHash local_1b8;
  Script SStack_198;
  Pubkey PStack_160;
  ByteData BStack_148;
  Script SStack_130;
  BlockHash local_f8;
  Script SStack_d8;
  Pubkey PStack_a0;
  ByteData BStack_88;
  Script SStack_70;
  iterator local_38;
  pointer local_30;
  vector<PegoutTestVector,_std::allocator<PegoutTestVector>_> test_vectors;
  ScriptUtil_CreatePegoutLogkingScriptTest_Test *this_local;
  
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_4c0 = &local_4b8;
  test_vectors.super__Vector_base<PegoutTestVector,_std::allocator<PegoutTestVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::BlockHash::BlockHash(&local_4c0->genesisblock_hash);
  local_4f5 = 1;
  cfd::core::Script::Script(&local_4b8.parent_locking_script);
  local_4f4 = 1;
  cfd::core::Pubkey::Pubkey(&local_4b8.btc_pubkey_bytes);
  local_4f3 = 1;
  cfd::core::ByteData::ByteData(&local_4b8.whitelist_proof);
  local_4f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f0,"6a0000",&local_4f1);
  cfd::core::Script::Script(&local_4b8.expect_script,&local_4f0);
  local_4f2 = 0;
  local_4f3 = 0;
  local_4f4 = 0;
  local_4f5 = 0;
  local_4c0 = (PegoutTestVector *)&local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_518,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_519);
  cfd::core::BlockHash::BlockHash(&local_3f8,&local_518);
  local_5bd = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_540,"a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487",&local_541);
  cfd::core::Script::Script(&SStack_3d8,&local_540);
  local_5bc = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_568,
             "03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c",&local_569);
  cfd::core::Pubkey::Pubkey(&PStack_3a0,&local_568);
  local_5bb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_590,
             "01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_591);
  cfd::core::ByteData::ByteData(&BStack_388,&local_590);
  local_5ba = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5b8,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4872103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_5b9);
  cfd::core::Script::Script(&SStack_370,&local_5b8);
  local_5ba = 0;
  local_5bb = 0;
  local_5bc = 0;
  local_5bd = 0;
  local_4c0 = (PegoutTestVector *)&local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5e0,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_5e1);
  cfd::core::BlockHash::BlockHash(&local_338,&local_5e0);
  local_685 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_609);
  cfd::core::Script::Script(&SStack_318,&local_608);
  local_684 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,
             "03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c",&local_631);
  cfd::core::Pubkey::Pubkey(&PStack_2e0,&local_630);
  local_683 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_658,
             "01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_659);
  cfd::core::ByteData::ByteData(&BStack_2c8,&local_658);
  local_682 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_680,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a4372103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_681);
  cfd::core::Script::Script(&SStack_2b0,&local_680);
  local_682 = 0;
  local_683 = 0;
  local_684 = 0;
  local_685 = 0;
  local_4c0 = (PegoutTestVector *)&local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6a8,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_6a9);
  cfd::core::BlockHash::BlockHash(&local_278,&local_6a8);
  local_725 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6d0,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_6d1);
  cfd::core::Script::Script(&SStack_258,&local_6d0);
  local_724 = 1;
  cfd::core::Pubkey::Pubkey(&PStack_220);
  local_723 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6f8,
             "01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"
             ,&local_6f9);
  cfd::core::ByteData::ByteData(&BStack_208,&local_6f8);
  local_722 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_720,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"
             ,&local_721);
  cfd::core::Script::Script(&SStack_1f0,&local_720);
  local_722 = 0;
  local_723 = 0;
  local_724 = 0;
  local_725 = 0;
  local_4c0 = (PegoutTestVector *)&local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_748,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_749);
  cfd::core::BlockHash::BlockHash(&local_1b8,&local_748);
  local_7c5 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_770,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_771);
  cfd::core::Script::Script(&SStack_198,&local_770);
  local_7c4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_798,
             "03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c",&local_799);
  cfd::core::Pubkey::Pubkey(&PStack_160,&local_798);
  local_7c3 = 1;
  cfd::core::ByteData::ByteData(&BStack_148);
  local_7c2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7c0,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"
             ,&local_7c1);
  cfd::core::Script::Script(&SStack_130,&local_7c0);
  local_7c2 = 0;
  local_7c3 = 0;
  local_7c4 = 0;
  local_7c5 = 0;
  local_4c0 = (PegoutTestVector *)&local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7e8,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_7e9);
  cfd::core::BlockHash::BlockHash(&local_f8,&local_7e8);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_810,
             "002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437",&local_811);
  cfd::core::Script::Script(&SStack_d8,&local_810);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = 1;
  cfd::core::Pubkey::Pubkey(&PStack_a0);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  cfd::core::ByteData::ByteData(&BStack_88);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_838,
             "6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"
             ,(allocator *)
              ((long)&actual.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&SStack_70,&local_838);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_38 = &local_4b8;
  local_30 = (pointer)0x6;
  this_00 = (allocator<PegoutTestVector> *)
            ((long)&actual.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<PegoutTestVector>::allocator(this_00);
  __l._M_len = (size_type)local_30;
  __l._M_array = local_38;
  std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>::vector
            ((vector<PegoutTestVector,_std::allocator<PegoutTestVector>_> *)&stack0xffffffffffffffd8
             ,__l,this_00);
  std::allocator<PegoutTestVector>::~allocator
            ((allocator<PegoutTestVector> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_bd8 = (PegoutTestVector *)&stack0xffffffffffffffc8;
  do {
    local_bd8 = local_bd8 + -1;
    PegoutTestVector::~PegoutTestVector(local_bd8);
  } while (local_bd8 != &local_4b8);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  cfd::core::Script::Script((Script *)&__range1);
  __end1 = std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>::begin
                     ((vector<PegoutTestVector,_std::allocator<PegoutTestVector>_> *)
                      &stack0xffffffffffffffd8);
  test_vector.expect_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>::end
                          ((vector<PegoutTestVector,_std::allocator<PegoutTestVector>_> *)
                           &stack0xffffffffffffffd8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<PegoutTestVector_*,_std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>_>
                                     *)&test_vector.expect_script.script_stack_.
                                        super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)
  {
    pPVar2 = __gnu_cxx::
             __normal_iterator<PegoutTestVector_*,_std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>_>
             ::operator*(&__end1);
    PegoutTestVector::PegoutTestVector((PegoutTestVector *)local_950,pPVar2);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreatePegoutLogkingScript
                  (&local_988,(BlockHash *)local_950,
                   (Script *)
                   ((long)&test_vector.genesisblock_hash.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data + 0x10),
                   (Pubkey *)
                   &test_vector.parent_locking_script.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (ByteData *)
                   ((long)&test_vector.btc_pubkey_bytes.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data + 0x10));
        cfd::core::Script::operator=((Script *)&__range1,&local_988);
        cfd::core::Script::~Script(&local_988);
      }
    }
    else {
      testing::Message::Message(local_998);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1e3,
                 "Expected: (actual = ScriptUtil::CreatePegoutLogkingScript(test_vector.genesisblock_hash, test_vector.parent_locking_script, test_vector.btc_pubkey_bytes, test_vector.whitelist_proof)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_998);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_998);
    }
    cfd::core::Script::GetHex_abi_cxx11_(&local_9d0,(Script *)&__range1);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_
              (&local_9f0,
               (Script *)
               &test_vector.whitelist_proof.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    rhs = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_9b0,"actual.GetHex().c_str()",
               "test_vector.expect_script.GetHex().c_str()",pcVar3,rhs);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::~string((string *)&local_9d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
    if (!bVar1) {
      testing::Message::Message(&local_9f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
      testing::internal::AssertHelper::AssertHelper
                (&local_a00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x1e4,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a00,&local_9f8);
      testing::internal::AssertHelper::~AssertHelper(&local_a00);
      testing::Message::~Message(&local_9f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
    PegoutTestVector::~PegoutTestVector((PegoutTestVector *)local_950);
    __gnu_cxx::
    __normal_iterator<PegoutTestVector_*,_std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Script::~Script((Script *)&__range1);
  std::vector<PegoutTestVector,_std::allocator<PegoutTestVector>_>::~vector
            ((vector<PegoutTestVector,_std::allocator<PegoutTestVector>_> *)&stack0xffffffffffffffd8
            );
  return;
}

Assistant:

TEST(ScriptUtil, CreatePegoutLogkingScriptTest) {
  std::vector<PegoutTestVector> test_vectors = {
    {
      BlockHash(),
      Script(),
      Pubkey(),
      ByteData(),
      Script("6a0000"),
    },
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb4872103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
    },
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a4372103d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
    },
    // invalid Pubkey
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey(),
      ByteData("01044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d0066"),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
    // empty whitelist proof
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey("03d12ccde87bdbed99cdad58f4eeab0db9c8d52810133d3ed9aaf6cd802a33a57c"),
      ByteData(),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
    // invalid Pubkey and empty whitelist proof
    {
      BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
      Script("002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
      Pubkey(),
      ByteData(),
      Script("6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f22002087cb0bc07de5b5befd7565b2c63fb1681efd8af7bd85a3f0f98a529a5c50a437"),
    },
  };

  Script actual;
  for (PegoutTestVector test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreatePegoutLogkingScript(test_vector.genesisblock_hash, test_vector.parent_locking_script, test_vector.btc_pubkey_bytes, test_vector.whitelist_proof)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_script.GetHex().c_str());
  }
}